

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void test_stats(void)

{
  roaring_bitmap_t *r;
  uint64_t uVar1;
  uint32_t i;
  uint32_t val;
  uint val_00;
  roaring_statistics_t stats;
  
  r = roaring_bitmap_create();
  _assert_true((unsigned_long)r,"r1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x222);
  for (val = 100; val != 1000; val = val + 1) {
    roaring_bitmap_add(r,val);
  }
  for (val_00 = 1000; val_00 < 100000; val_00 = val_00 + 10) {
    roaring_bitmap_add(r,val_00);
  }
  roaring_bitmap_add(r,100000);
  roaring_bitmap_statistics(r,&stats);
  uVar1 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(stats.cardinality == uVar1),
               "stats.cardinality == roaring_bitmap_get_cardinality(r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x22e);
  _assert_true((ulong)(stats.min_value == 100),"stats.min_value == 100",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x22f);
  _assert_true((ulong)(stats.max_value == 100000),"stats.max_value == 100000",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0x230);
  roaring_bitmap_free(r);
  return;
}

Assistant:

DEFINE_TEST(test_stats) {
    // create a new empty bitmap
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_non_null(r1);
    // then we can add values
    for (uint32_t i = 100; i < 1000; i++) {
        roaring_bitmap_add(r1, i);
    }
    for (uint32_t i = 1000; i < 100000; i += 10) {
        roaring_bitmap_add(r1, i);
    }
    roaring_bitmap_add(r1, 100000);

    roaring_statistics_t stats;
    roaring_bitmap_statistics(r1, &stats);
    assert_true(stats.cardinality == roaring_bitmap_get_cardinality(r1));
    assert_true(stats.min_value == 100);
    assert_true(stats.max_value == 100000);
    roaring_bitmap_free(r1);
}